

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,2ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,2ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  int *value;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX_00;
  tuple<char,_int,_double,_const_char_*> *tuple_00;
  undefined8 uVar7;
  ulong uVar8;
  ostringstream os;
  string local_1f8;
  string local_1d8;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  string_maker<int>::to_string_abi_cxx11_(&local_1f8,(string_maker<int> *)(this + 0x10),value);
  paVar2 = &local_1d8.field_2;
  paVar3 = &local_1f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p == paVar3) {
    local_1d8.field_2._8_8_ = local_1f8.field_2._8_8_;
    local_1d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1d8._M_dataplus._M_p = local_1f8._M_dataplus._M_p;
  }
  local_1d8.field_2._M_allocated_capacity = local_1f8.field_2._M_allocated_capacity;
  local_1d8._M_string_length = local_1f8._M_string_length;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  tuple_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
    tuple_00 = extraout_RDX_00;
  }
  make_tuple_string<std::tuple<char,int,double,char_const*>,1ul>::make_abi_cxx11_
            (&local_1d8,(make_tuple_string<std::tuple<char,int,double,char_const*>,1ul> *)this,
             tuple_00);
  std::__cxx11::ostringstream::str();
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    uVar7 = local_1d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_1b0 + local_1d8._M_string_length) {
    uVar8 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar8 = local_1a8[0];
    }
    if (local_1b0 + local_1d8._M_string_length <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
      goto LAB_001dcb2e;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8);
LAB_001dcb2e:
  puVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_1f8.field_2._M_allocated_capacity = *puVar1;
    local_1f8.field_2._8_8_ = puVar6[3];
    local_1f8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *puVar1;
    local_1f8._M_dataplus._M_p = (pointer)*puVar6;
  }
  sVar4 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p == paVar3) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1f8.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1f8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1f8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1f8.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar4;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity =
       local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1f8._M_dataplus._M_p = (pointer)paVar3;
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }